

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O2

void apply_yolo(yolo_layer *layer)

{
  pointer pfVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int location;
  ulong uVar6;
  
  pfVar1 = (layer->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(layer->mask).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  iVar3 = layer->h * layer->w;
  uVar6 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  while (iVar2 = (int)uVar5, uVar5 = (ulong)(iVar2 - 1), iVar2 != 0) {
    location = (int)uVar6;
    iVar2 = yolo_layer::entry_index(layer,location,0);
    activate_array(pfVar1 + iVar2,iVar3 * 2);
    iVar2 = yolo_layer::entry_index(layer,location,4);
    activate_array(pfVar1 + iVar2,(layer->classes + 1) * iVar3);
    uVar6 = (ulong)(uint)(location + iVar3);
  }
  return;
}

Assistant:

static void apply_yolo(yolo_layer & layer)
{
    int w = layer.w;
    int h = layer.h;
    int N = layer.mask.size();
    float * data = layer.predictions.data();
    for (int n = 0; n < N; n++) {
        int index = layer.entry_index(n*w*h, 0);
        activate_array(data + index, 2*w*h);
        index = layer.entry_index(n*w*h, 4);
        activate_array(data + index, (1+layer.classes)*w*h);
    }
}